

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

ssize_t __thiscall
Json::StyledWriter::write_abi_cxx11_(StyledWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  long lVar1;
  Value *in_stack_00000048;
  StyledWriter *in_stack_00000050;
  Value *in_stack_00000088;
  StyledWriter *in_stack_00000090;
  Value *in_stack_000001d8;
  StyledWriter *in_stack_000001e0;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::operator=((string *)(lVar1 + 0x20),"");
  *(undefined1 *)(lVar1 + 0x68) = 0;
  std::__cxx11::string::operator=((string *)(lVar1 + 0x40),"");
  writeCommentBeforeValue(in_stack_00000050,in_stack_00000048);
  writeValue(in_stack_000001e0,in_stack_000001d8);
  writeCommentAfterValueOnSameLine(in_stack_00000090,in_stack_00000088);
  std::__cxx11::string::operator+=((string *)(lVar1 + 0x20),"\n");
  std::__cxx11::string::string((string *)this,(string *)(lVar1 + 0x20));
  return (ssize_t)this;
}

Assistant:

std::string StyledWriter::write(const Value& root) {
  document_ = "";
  addChildValues_ = false;
  indentString_ = "";
  writeCommentBeforeValue(root);
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  document_ += "\n";
  return document_;
}